

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O2

void rsvd(double *A,int M,int N,int K,int oversample,int n_iter,double *U,double *V,double *S)

{
  time_t tVar1;
  long lVar2;
  double *A_00;
  double *C;
  double *col;
  int *ipiv;
  double *R;
  double *bvec;
  double *U_00;
  double *V_00;
  double *q;
  ulong uVar3;
  ulong uVar4;
  double *pdVar5;
  long lVar6;
  ulong uVar7;
  size_t sVar8;
  int N_00;
  size_t __size;
  ulong uVar9;
  bool bVar10;
  int local_74;
  
  if (n_iter == 0) {
    puts(
        "Number of power iterations must be >= 1 or set it to < 0 if you want to use default value #RSVD_POWER_ITERATIONS "
        );
  }
  else {
    if (n_iter < 0) {
      n_iter = 5;
    }
    tVar1 = time((time_t *)0x0);
    srand((uint)tVar1);
    if (N <= M) {
      N_00 = oversample + K;
      lVar6 = (long)M * 8;
      lVar2 = (long)N_00;
      sVar8 = lVar6 * lVar2;
      A_00 = (double *)malloc(sVar8);
      C = (double *)malloc(sVar8);
      col = (double *)malloc(lVar6 * N);
      ipiv = (int *)malloc((long)M << 2);
      sVar8 = lVar2 * 8;
      __size = sVar8 * lVar2;
      R = (double *)malloc(__size);
      bvec = (double *)malloc(__size);
      U_00 = (double *)malloc(__size);
      V_00 = (double *)malloc((long)N * sVar8);
      q = (double *)malloc(sVar8);
      random_matrix(A_00,N,N_00);
      mtranspose(A,M,N,col);
      local_74 = n_iter;
      while( true ) {
        mmult(A,A_00,C,M,N,N_00);
        bVar10 = local_74 == 0;
        local_74 = local_74 + -1;
        if (bVar10) break;
        rludecomp(C,M,N_00,ipiv);
        getPU(C,M,N_00,ipiv,A_00,(double *)0x0);
        mmult(col,A_00,C,N,M,N_00);
        rludecomp(C,N,N_00,ipiv);
        getPU(C,N,N_00,ipiv,A_00,(double *)0x0);
      }
      qrdecomp(C,M,N_00,bvec);
      getQR(C,M,N_00,bvec,A_00,R);
      mtranspose(A_00,M,N_00,C);
      mmult(C,A,A_00,N_00,M,N);
      svd_transpose(A_00,N_00,N,U_00,V_00,q);
      uVar3 = 0;
      uVar9 = 0;
      if (0 < K) {
        uVar9 = (ulong)(uint)K;
      }
      lVar6 = (long)K;
      uVar4 = (ulong)(uint)N;
      if (N < 1) {
        uVar4 = 0;
      }
      pdVar5 = V_00;
      for (; uVar3 != uVar4; uVar3 = uVar3 + 1) {
        for (uVar7 = 0; uVar9 != uVar7; uVar7 = uVar7 + 1) {
          V[uVar7] = pdVar5[uVar7];
        }
        V = V + lVar6;
        pdVar5 = pdVar5 + lVar2;
      }
      memcpy(S,q,lVar6 * 8);
      itranspose(C,N_00,M);
      mmult(C,U_00,A_00,M,N_00,N_00);
      uVar4 = 0;
      pdVar5 = A_00;
      uVar3 = (ulong)(uint)M;
      if (M < 1) {
        uVar3 = uVar4;
      }
      for (; uVar4 != uVar3; uVar4 = uVar4 + 1) {
        for (uVar7 = 0; uVar9 != uVar7; uVar7 = uVar7 + 1) {
          U[uVar7] = pdVar5[uVar7];
        }
        U = U + lVar6;
        pdVar5 = pdVar5 + lVar2;
      }
      free(A_00);
      free(C);
      free(ipiv);
      free(col);
      free(R);
      free(bvec);
      free(U_00);
      free(V_00);
      free(q);
      return;
    }
    printf("Randomized SVD is only implemented for tall matrices (rows > columns)");
  }
  exit(-1);
}

Assistant:

void rsvd(double *A, int M, int N,int K, int oversample, int n_iter,double *U, double *V, double *S) {
	/*
	A - MXN matrix
	K - Rank of approximation being constructed. K <= min(m,n). default value 6
	L - block size of the normalized power iterations. Default K+2
	n_iter - number of normalized power iterations to conduct. Default 2
	U - MXK
	V - NXK
	S - Diagonal Matrix KXK
	*/

	if (n_iter == 0) {
		printf("Number of power iterations must be >= 1 or set it to < 0 if you want to use default value #RSVD_POWER_ITERATIONS \n");
		exit(-1);
	}
	else if (n_iter < 0) {
		n_iter = (int)RSVD_POWER_ITERATIONS;
	}

	int i, j,maxdim,L;
	double *Q1,*Q2,*AT,*R,*bvec,*uq,*vq,*sq;
	int *ipiv;

	L = K + oversample;

	maxdim = M > N ? M : N;
	srand(time(NULL));

	if (M >= N) {

		Q1 = (double*)malloc(sizeof(double)*maxdim*L);
		Q2 = (double*)malloc(sizeof(double)*maxdim*L);
		AT = (double*)malloc(sizeof(double)*M*N);
		ipiv = (int*)malloc(sizeof(int)*maxdim);
		R = (double*)malloc(sizeof(double)*L*L);
		bvec = (double*)malloc(sizeof(double)*L*L);

		uq = (double*)malloc(sizeof(double)*L*L);
		vq = (double*)malloc(sizeof(double)*L*N);
		sq = (double*)malloc(sizeof(double)*L);

		random_matrix(Q1, N, L);// N*L
		
		mtranspose(A, M, N, AT);

		for (i = 0; i < n_iter; ++i) {
			mmult(A, Q1, Q2, M, N, L);// M*L
			rludecomp(Q2, M, L, ipiv);
			getPU(Q2, M, L, ipiv, Q1, NULL);// M*L
			mmult(AT, Q1, Q2, N, M, L);//N*L
			rludecomp(Q2, N, L, ipiv);
			getPU(Q2, N, L, ipiv, Q1, NULL);// N*L
		}

		mmult(A, Q1, Q2, M, N, L);
		qrdecomp(Q2, M, L, bvec);
		getQR(Q2, M, L, bvec, Q1, R);// M*L

		mtranspose(Q1, M, L, Q2);// L*M
		mmult(Q2, A, Q1, L, M, N);// L* N

		svd_transpose(Q1, L, N, uq, vq, sq);
		// uq - LXL
		// vq - NXL
		//itranspose(vq, N, L);

		for (i = 0; i < N; ++i) {
			for (j = 0; j < K; ++j) {
				V[i*K + j] = vq[i*L + j];
			}
		}

		memcpy(S, sq, sizeof(double)*K);
		
		itranspose(Q2, L, M);

		mmult(Q2, uq, Q1, M, L, L);

		for (i = 0; i < M; ++i) {
			for (j = 0; j < K; ++j) {
				U[i*K + j] = Q1[i*L + j];
			}
		}

		free(Q1);
		free(Q2);
		free(ipiv);
		free(AT);
		free(R);
		free(bvec);
		free(uq);
		free(vq);
		free(sq);

	}
	else {
		printf("Randomized SVD is only implemented for tall matrices (rows > columns)");
		exit(-1);
	}

}